

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_heap.c
# Opt level: O1

void adt_heap_sortUp(adt_ary_t *heap,int32_t childIndex,adt_heap_family heapFamily)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  void **ppvVar5;
  void **ppvVar6;
  void *tmp;
  uint s32Index;
  
  while( true ) {
    if (heap == (adt_ary_t *)0x0) {
      return;
    }
    if (childIndex < 1) {
      return;
    }
    s32Index = childIndex - 1U >> 1;
    ppvVar5 = adt_ary_get(heap,childIndex);
    ppvVar6 = adt_ary_get(heap,s32Index);
    if ((ppvVar5 == (void **)0x0) || (ppvVar6 == (void **)0x0)) {
      __assert_fail("(ppChild != 0) && (ppParent != 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                    ,0x50,"void adt_heap_sortUp(adt_ary_t *, int32_t, adt_heap_family)");
    }
    pvVar3 = *ppvVar5;
    uVar2 = *(uint *)((long)pvVar3 + 8);
    uVar1 = *(uint *)((long)*ppvVar6 + 8);
    bVar4 = uVar2 >= uVar1 && uVar2 != uVar1;
    if (heapFamily == ADT_MIN_HEAP) {
      bVar4 = uVar2 < uVar1;
    }
    if (!bVar4) break;
    *ppvVar5 = *ppvVar6;
    *ppvVar6 = pvVar3;
    bVar4 = (uint)childIndex < 3;
    childIndex = s32Index;
    if (bVar4) {
      return;
    }
  }
  return;
}

Assistant:

void adt_heap_sortUp(adt_ary_t *heap, int32_t childIndex, adt_heap_family heapFamily){
   if ( (heap != 0) && (childIndex>0) ){
      bool swapItems = false;
      void **ppChild, **ppParent;
      adt_heap_elem_t *pChildElem, *pParentElem;
      //parent index is at floor((childIndex-1)/2)
      int32_t parentIndex = (childIndex-1)>>1;

      ppChild = adt_ary_get(heap, childIndex);
      ppParent = adt_ary_get(heap, parentIndex);
      assert ( (ppChild != 0) && (ppParent != 0) );
      pChildElem = *ppChild;
      pParentElem = *ppParent;
      if (heapFamily == ADT_MIN_HEAP){
         if (pChildElem->u32Value < pParentElem->u32Value){
            swapItems = true;
         }
      }
      else {
         //implicit ADT_MAX_HEAP
         if (pChildElem->u32Value > pParentElem->u32Value){
            swapItems = true;
         }
      }
      if (swapItems == true){
         //swap parent and child
         void *tmp;
         tmp = *ppChild;
         *ppChild = *ppParent;
         *ppParent = tmp;

         //call recursively on parent (bubble up)
         if (parentIndex > 0) {
            adt_heap_sortUp(heap, parentIndex, heapFamily);
         }
      }
   }
}